

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t local_3c;
  undefined1 local_30 [8];
  sockaddr_in sin;
  uint16 port_local;
  uint32 ip_local;
  Socket *this_local;
  
  sin.sin_zero._2_2_ = SUB82(__addr,0);
  sin.sin_zero._4_4_ = __fd;
  memset(local_30,0,0x10);
  local_30._0_2_ = 2;
  local_30._2_2_ = htons(sin.sin_zero._2_2_);
  if (sin.sin_zero._4_4_ == -1) {
    local_3c = 0;
  }
  else {
    local_3c._0_1_ = sin.sin_zero[4];
    local_3c._1_1_ = sin.sin_zero[5];
    local_3c._2_1_ = sin.sin_zero[6];
    local_3c._3_1_ = sin.sin_zero[7];
  }
  uVar1 = htonl(local_3c);
  local_30._4_4_ = uVar1;
  uVar2 = htonl(0);
  if ((uVar1 == uVar2) && (uVar4 = (ulong)(ushort)sin.sin_zero._2_2_, sin.sin_zero._2_2_ == 0)) {
    this_local._7_1_ = 1;
  }
  else {
    uVar3 = ::bind(this->s,(sockaddr *)local_30,0x10);
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 0) {
      this_local._7_1_ = 0;
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  return (int)CONCAT71((int7)(uVar4 >> 8),this_local._7_1_);
}

Assistant:

bool Socket::bind(uint32 ip, uint16 port)
{
  struct sockaddr_in sin;
  memset(&sin, 0, sizeof(sin));
  sin.sin_family = AF_INET;
  sin.sin_port = htons(port);
  sin.sin_addr.s_addr = htonl((ip == INADDR_NONE) ? INADDR_ANY : ip);

  if(sin.sin_addr.s_addr == htonl(INADDR_ANY) && port == 0)
    return true;

  if(::bind(s, (struct sockaddr*)&sin, sizeof(sin)) < 0)
    return false;
  return true;
}